

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O3

bool __thiscall xmrig::Config::isShouldSave(Config *this)

{
  ConfigPrivate *pCVar1;
  undefined1 uVar2;
  
  if ((this->super_BaseConfig).m_autoSave == true) {
    pCVar1 = this->d_ptr;
    uVar2 = 1;
    if ((((pCVar1->cl).m_shouldSave == false) && ((pCVar1->cuda).m_shouldSave == false)) &&
       ((this->super_BaseConfig).m_upgrade == false)) {
      uVar2 = (pCVar1->cpu).m_shouldSave;
    }
    return (bool)uVar2;
  }
  return false;
}

Assistant:

bool xmrig::Config::isShouldSave() const
{
    if (!isAutoSave()) {
        return false;
    }

#   ifdef XMRIG_FEATURE_OPENCL
    if (cl().isShouldSave()) {
        return true;
    }
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    if (cuda().isShouldSave()) {
        return true;
    }
#   endif

    return (m_upgrade || cpu().isShouldSave());
}